

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O1

void __thiscall aeron::Subscription::~Subscription(Subscription *this)

{
  ~Subscription(this);
  operator_delete(this);
  return;
}

Assistant:

Subscription::~Subscription()
{
    m_conductor.releaseSubscription(m_registrationId, std::atomic_load_explicit(&m_imageList, std::memory_order_acquire));
}